

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O3

void ArgumentCheck(string *identifier_name,int line_number,int character_number,
                  vector<_SymbolType,_std::allocator<_SymbolType>_> *value_argument_type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  LogTools *pLVar2;
  bool bVar3;
  long *plVar4;
  undefined8 *puVar5;
  uint uVar6;
  long *plVar7;
  size_type *psVar8;
  ulong *puVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  undefined8 uVar16;
  uint uVar17;
  uint uVar18;
  string str2;
  string str1;
  string __str;
  string __str_1;
  vector<_SymbolType,_std::allocator<_SymbolType>_> argument_type;
  ulong *local_100;
  long local_f8;
  ulong local_f0;
  long lStack_e8;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string *local_60;
  vector<_SymbolType,_std::allocator<_SymbolType>_> local_58;
  vector<_SymbolType,_std::allocator<_SymbolType>_> *local_40;
  ulong local_38;
  
  bVar3 = FunctionTable::Find(handle_func_table,identifier_name);
  if (!bVar3) {
    return;
  }
  local_58.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FunctionTable::GetTermArgumentType(handle_func_table,identifier_name,&local_58);
  pLVar2 = g_log_tools;
  uVar15 = (ulong)((long)local_58.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_58.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>.
                        _M_impl.super__Vector_impl_data._M_start) >> 2;
  uVar12 = (ulong)((long)(value_argument_type->
                         super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(value_argument_type->
                        super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>)._M_impl.
                        super__Vector_impl_data._M_start) >> 2;
  uVar14 = (uint)uVar15;
  uVar11 = (uint)uVar12;
  local_60 = identifier_name;
  if (uVar14 == uVar11) {
    if (0 < (int)uVar14) {
      uVar12 = (ulong)(uVar14 & 0x7fffffff);
      uVar15 = 0;
      local_40 = value_argument_type;
      local_38 = uVar12;
      do {
        if (local_58.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl.
            super__Vector_impl_data._M_start[uVar15] !=
            (value_argument_type->super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>).
            _M_impl.super__Vector_impl_data._M_start[uVar15]) {
          std::__cxx11::string::string
                    ((string *)&local_c0,
                     symbol_type_string
                     [local_58.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl
                      .super__Vector_impl_data._M_start[uVar15]],(allocator *)&local_100);
          std::__cxx11::string::string
                    ((string *)&local_100,
                     symbol_type_string
                     [(value_argument_type->
                      super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>)._M_impl.
                      super__Vector_impl_data._M_start[uVar15]],(allocator *)&local_e0);
          pLVar2 = g_log_tools;
          std::operator+(&local_80,"argument expected: ",&local_c0);
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
          plVar7 = plVar4 + 2;
          if ((long *)*plVar4 == plVar7) {
            local_90 = *plVar7;
            lStack_88 = plVar4[3];
            local_a0 = &local_90;
          }
          else {
            local_90 = *plVar7;
            local_a0 = (long *)*plVar4;
          }
          local_98 = plVar4[1];
          *plVar4 = (long)plVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_100);
          psVar8 = (size_type *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_e0.field_2._M_allocated_capacity = *psVar8;
            local_e0.field_2._8_8_ = plVar4[3];
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          }
          else {
            local_e0.field_2._M_allocated_capacity = *psVar8;
            local_e0._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_e0._M_string_length = plVar4[1];
          *plVar4 = (long)psVar8;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          LogTools::SemanticErrorLogs(pLVar2,&local_e0,local_60,line_number,character_number);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p);
          }
          value_argument_type = local_40;
          if (local_a0 != &local_90) {
            operator_delete(local_a0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p);
          }
          if (local_100 != &local_f0) {
            operator_delete(local_100);
          }
          uVar12 = local_38;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p);
            uVar12 = local_38;
          }
        }
        uVar15 = uVar15 + 1;
      } while (uVar12 != uVar15);
    }
    goto LAB_0012f13a;
  }
  uVar18 = -uVar14;
  if (0 < (int)uVar14) {
    uVar18 = uVar14;
  }
  uVar17 = 1;
  if (9 < uVar18) {
    uVar13 = (ulong)uVar18;
    uVar6 = 4;
    do {
      uVar17 = uVar6;
      uVar10 = (uint)uVar13;
      if (uVar10 < 100) {
        uVar17 = uVar17 - 2;
        goto LAB_0012ee91;
      }
      if (uVar10 < 1000) {
        uVar17 = uVar17 - 1;
        goto LAB_0012ee91;
      }
      if (uVar10 < 10000) goto LAB_0012ee91;
      uVar13 = uVar13 / 10000;
      uVar6 = uVar17 + 4;
    } while (99999 < uVar10);
    uVar17 = uVar17 + 1;
  }
LAB_0012ee91:
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct((ulong)&local_a0,(char)uVar17 - ((char)(uVar15 >> 0x18) >> 7));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar14 >> 0x1f) + (long)local_a0),uVar17,uVar18);
  puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,0x15f57f);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  psVar8 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_e0.field_2._M_allocated_capacity = *psVar8;
    local_e0.field_2._8_8_ = puVar5[3];
  }
  else {
    local_e0.field_2._M_allocated_capacity = *psVar8;
    local_e0._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_e0._M_string_length = puVar5[1];
  *puVar5 = psVar8;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_e0);
  puVar9 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar9) {
    local_f0 = *puVar9;
    lStack_e8 = plVar4[3];
    local_100 = &local_f0;
  }
  else {
    local_f0 = *puVar9;
    local_100 = (ulong *)*plVar4;
  }
  local_f8 = plVar4[1];
  *plVar4 = (long)puVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar14 = -uVar11;
  if (0 < (int)uVar11) {
    uVar14 = uVar11;
  }
  uVar18 = 1;
  if (9 < uVar14) {
    uVar15 = (ulong)uVar14;
    uVar17 = 4;
    do {
      uVar18 = uVar17;
      uVar6 = (uint)uVar15;
      if (uVar6 < 100) {
        uVar18 = uVar18 - 2;
        goto LAB_0012efdb;
      }
      if (uVar6 < 1000) {
        uVar18 = uVar18 - 1;
        goto LAB_0012efdb;
      }
      if (uVar6 < 10000) goto LAB_0012efdb;
      uVar15 = uVar15 / 10000;
      uVar17 = uVar18 + 4;
    } while (99999 < uVar6);
    uVar18 = uVar18 + 1;
  }
LAB_0012efdb:
  paVar1 = &local_80.field_2;
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_80,(char)uVar18 - ((char)(uVar12 >> 0x18) >> 7));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_80._M_dataplus._M_p + (uVar11 >> 0x1f),uVar18,uVar14);
  uVar12 = 0xf;
  if (local_100 != &local_f0) {
    uVar12 = local_f0;
  }
  if (uVar12 < local_80._M_string_length + local_f8) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      uVar16 = local_80.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_80._M_string_length + local_f8) goto LAB_0012f05d;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_100);
  }
  else {
LAB_0012f05d:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_80._M_dataplus._M_p);
  }
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  psVar8 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_c0.field_2._M_allocated_capacity = *psVar8;
    local_c0.field_2._8_8_ = puVar5[3];
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar8;
    local_c0._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_c0._M_string_length = puVar5[1];
  *puVar5 = psVar8;
  puVar5[1] = 0;
  *(undefined1 *)psVar8 = 0;
  LogTools::SemanticErrorLogs(pLVar2,&local_c0,local_60,line_number,character_number);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0);
  }
LAB_0012f13a:
  if (local_58.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ArgumentCheck(const string& identifier_name, int line_number, int character_number, vector<SymbolType>& value_argument_type) {
    if (!handle_func_table->Find(identifier_name)) {
        return;
    }
    vector<SymbolType> argument_type;
    handle_func_table->GetTermArgumentType(identifier_name, argument_type);
    int argument_type_len = argument_type.size();
    int value_argument_type_len = value_argument_type.size();
    if (argument_type_len != value_argument_type_len) {
        g_log_tools->SemanticErrorLogs("argument list expected: " + std::to_string(argument_type_len) + ", but value argument list had: "
                + std::to_string(value_argument_type_len), identifier_name, line_number, character_number);
        return;
    }
    for (int i=0; i<value_argument_type_len; ++i) {
        if (argument_type[i] != value_argument_type[i]) {
            string str1 = symbol_type_string[argument_type[i]];
            string str2 = symbol_type_string[value_argument_type[i]];
            g_log_tools->SemanticErrorLogs("argument expected: " + str1 + ", but value argument had: " + str2, identifier_name, line_number, character_number);
        }
    }
}